

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O1

void rr::anon_unknown_19::makeSharedVerticeDistinct
               (VertexPacket **packet,
               set<rr::VertexPacket_*,_std::less<void_*>,_std::allocator<rr::VertexPacket_*>_>
               *vertices,VertexPacketAllocator *vpalloc)

{
  _Rb_tree_header *p_Var1;
  VertexPacket *pVVar2;
  undefined8 uVar3;
  VertexPacket *pVVar4;
  _Base_ptr p_Var5;
  long lVar6;
  _Base_ptr p_Var7;
  ulong uVar8;
  
  p_Var7 = (vertices->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(vertices->_M_t)._M_impl.super__Rb_tree_header;
  p_Var5 = &p_Var1->_M_header;
  if (p_Var7 != (_Base_ptr)0x0) {
    do {
      if (*(VertexPacket **)(p_Var7 + 1) >= *packet) {
        p_Var5 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(VertexPacket **)(p_Var7 + 1) < *packet];
    } while (p_Var7 != (_Base_ptr)0x0);
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var7 = p_Var5, *packet < *(VertexPacket **)(p_Var5 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    std::
    _Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
    ::_M_insert_unique<rr::VertexPacket*const&>
              ((_Rb_tree<rr::VertexPacket*,rr::VertexPacket*,std::_Identity<rr::VertexPacket*>,std::less<void*>,std::allocator<rr::VertexPacket*>>
                *)vertices,packet);
    return;
  }
  pVVar4 = VertexPacketAllocator::alloc(vpalloc);
  uVar3 = *(undefined8 *)(((*packet)->position).m_data + 2);
  *(undefined8 *)(pVVar4->position).m_data = *(undefined8 *)((*packet)->position).m_data;
  *(undefined8 *)((pVVar4->position).m_data + 2) = uVar3;
  pVVar2 = *packet;
  pVVar4->pointSize = pVVar2->pointSize;
  pVVar4->primitiveID = pVVar2->primitiveID;
  if (vpalloc->m_numberOfVertexOutputs != 0) {
    lVar6 = 0x2c;
    uVar8 = 0;
    do {
      pVVar2 = *packet;
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar6 + -0x14) =
           *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -0x14);
      *(undefined4 *)((long)(&pVVar4->position + -1) + lVar6) =
           *(undefined4 *)((long)(&pVVar2->position + -1) + lVar6);
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar6 + -0xc) =
           *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -0xc);
      *(undefined4 *)((long)(pVVar4->position).m_data + lVar6 + -8) =
           *(undefined4 *)((long)(pVVar2->position).m_data + lVar6 + -8);
      uVar8 = uVar8 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar8 < vpalloc->m_numberOfVertexOutputs);
  }
  *packet = pVVar4;
  return;
}

Assistant:

void makeSharedVerticeDistinct (VertexPacket*& packet, std::set<VertexPacket*, std::less<void*> >& vertices, VertexPacketAllocator& vpalloc)
{
	// distinct
	if (vertices.find(packet) == vertices.end())
	{
		vertices.insert(packet);
	}
	else
	{
		VertexPacket* newPacket = vpalloc.alloc();

		// copy packet output values
		newPacket->position		= packet->position;
		newPacket->pointSize	= packet->pointSize;
		newPacket->primitiveID	= packet->primitiveID;

		for (size_t outputNdx = 0; outputNdx < vpalloc.getNumVertexOutputs(); ++outputNdx)
			newPacket->outputs[outputNdx] = packet->outputs[outputNdx];

		// no need to insert new packet to "vertices" as newPacket is unique
		packet = newPacket;
	}
}